

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall Mond::Lexer::GetToken(Lexer *this)

{
  uint curr;
  Pos PVar1;
  Source *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Token *pTVar6;
  DiagBuilder *pDVar7;
  Slice SVar8;
  Slice SVar9;
  TokenType type;
  
  curr = this->m_char;
  if ((int)curr < 10) {
    if (curr == 0) {
      (this->m_token).type = TokEndOfFile;
      PVar1 = this->m_pos;
      pSVar2 = this->m_source;
      iVar4 = PVar1.line;
      (this->m_token).range.beg.line = iVar4;
      iVar5 = PVar1.column;
      (this->m_token).range.beg.column = iVar5;
      (this->m_token).range.end.line = iVar4;
      (this->m_token).range.end.column = iVar5;
      iVar4 = (*pSVar2->_vptr_Source[4])();
      iVar5 = (*this->m_source->_vptr_Source[4])();
      SVar9.end = iVar5;
      SVar9.beg = iVar4;
      (this->m_token).slice = SVar9;
      goto LAB_00118e1e;
    }
    if (curr == 9) goto LAB_00118d88;
  }
  else {
    if ((curr == 10) || (curr == 0xd)) {
      pTVar6 = MakeEndOfLine(this);
      return pTVar6;
    }
    if (curr == 0x20) {
LAB_00118d88:
      pTVar6 = MakeWhitespace(this);
      return pTVar6;
    }
  }
  if (this->m_peek == 0x2f && (curr ^ 0x2f) == 0) {
    pTVar6 = MakeLineComment(this);
    return pTVar6;
  }
  if ((curr ^ 0x2f) == 0 && this->m_peek == 0x2a) {
    pTVar6 = MakeBlockComment(this);
    return pTVar6;
  }
  if (0x19 < (curr & 0xffffffdf) - 0x41) {
    if ((curr == 0x22) || (curr == 0x27)) {
      pTVar6 = MakeStringLiteral(this);
      return pTVar6;
    }
    if (curr != 0x5f) {
      if (curr - 0x30 < 10) {
        pTVar6 = MakeNumberLiteral(this);
        return pTVar6;
      }
      if ((int)curr < 0x3b) {
        if ((int)curr < 0x2c) {
          if (curr == 0x28) {
            type = TokLeftParen;
            goto LAB_00118f37;
          }
          if (curr == 0x29) {
            type = TokRightParen;
            goto LAB_00118f37;
          }
        }
        else {
          if (curr == 0x2c) {
            type = TokComma;
            goto LAB_00118f37;
          }
          if (curr == 0x3a) {
            type = TokColon;
            goto LAB_00118f37;
          }
        }
      }
      else if ((int)curr < 0x5d) {
        if (curr == 0x3b) {
          type = TokSemicolon;
          goto LAB_00118f37;
        }
        if (curr == 0x5b) {
          type = TokLeftBracket;
          goto LAB_00118f37;
        }
      }
      else {
        if (curr == 0x5d) {
          type = TokRightBracket;
LAB_00118f37:
          pTVar6 = MakePunctuation(this,type);
          return pTVar6;
        }
        if (curr == 0x7b) {
          type = TokLeftBrace;
          goto LAB_00118f37;
        }
        if (curr == 0x7d) {
          type = TokRightBrace;
          goto LAB_00118f37;
        }
      }
      bVar3 = OperatorLookup1(curr,&(this->m_token).type);
      if (bVar3) {
        pTVar6 = MakeOperator(this);
        return pTVar6;
      }
      pDVar7 = DiagBuilder::operator<<(this->m_diag,this->m_pos);
      pDVar7 = DiagBuilder::operator<<(pDVar7,Error);
      pDVar7 = DiagBuilder::operator<<(pDVar7,LexUnexpectedCharacter);
      pDVar7 = DiagBuilder::operator<<(pDVar7,this->m_char);
      DiagBuilder::operator<<(pDVar7,DiagEnd);
      (this->m_token).type = TokUnknown;
      PVar1 = this->m_pos;
      pSVar2 = this->m_source;
      iVar4 = PVar1.line;
      (this->m_token).range.beg.line = iVar4;
      iVar5 = PVar1.column;
      (this->m_token).range.beg.column = iVar5;
      (this->m_token).range.end.line = iVar4;
      (this->m_token).range.end.column = iVar5 + 1;
      SVar8.beg = (*pSVar2->_vptr_Source[4])();
      SVar8.end = SVar8.beg + 1;
      (this->m_token).slice = SVar8;
      Advance(this);
LAB_00118e1e:
      return &this->m_token;
    }
  }
  pTVar6 = MakeIdentifier(this);
  return pTVar6;
}

Assistant:

Token &Lexer::GetToken()
{
	if (IsEof(m_char))
	{
		m_token.type = TokEndOfFile;
		m_token.range = Range(m_pos, 0);
		m_token.slice = Slice(m_source.Position(), m_source.Position());
		return m_token;
	}
	else if (m_char == '\r' || m_char == '\n')
	{
		return MakeEndOfLine();
	}
	else if (IsWhitespace(m_char))
	{
		return MakeWhitespace();
	}
	else if (m_char == '/' && m_peek == '/')
	{
		return MakeLineComment();
	}
	else if (m_char == '/' && m_peek == '*')
	{
		return MakeBlockComment();
	}
	else if (IsLetter(m_char) || m_char == '_')
	{
		return MakeIdentifier();
	}
	else if (m_char == '\"' || m_char == '\'')
	{
		return MakeStringLiteral();
	}
	else if (IsDecDigit(m_char))
	{
		return MakeNumberLiteral();
	}

	switch (m_char)
	{
	case ':': return MakePunctuation(TokColon);
	case ',': return MakePunctuation(TokComma);
	case ';': return MakePunctuation(TokSemicolon);
	case '(': return MakePunctuation(TokLeftParen);
	case ')': return MakePunctuation(TokRightParen);
	case '{': return MakePunctuation(TokLeftBrace);
	case '}': return MakePunctuation(TokRightBrace);
	case '[': return MakePunctuation(TokLeftBracket);
	case ']': return MakePunctuation(TokRightBracket);
	}

	// TODO: Handle !in and ... properly, and move them out of the operator table.
	// !in isn't handled at all currently.

	if (OperatorLookup1(m_char, m_token.type))
	{
		return MakeOperator();
	}

	m_diag
		<< m_pos
		<< Error
		<< LexUnexpectedCharacter
		<< m_char
		<< DiagEnd;

	m_token.type = TokUnknown;
	m_token.range = Range(m_pos, 1);
	m_token.slice = Slice(m_source.Position());
	Advance();
	return m_token;
}